

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O3

bool __thiscall ObjectIdentifier::ToString(ObjectIdentifier *this,wstring *out)

{
  byte *pbVar1;
  char *__s;
  size_t sVar2;
  wstring *pwVar3;
  pointer puVar4;
  ulong uVar5;
  byte *pbVar6;
  long lVar7;
  byte *pbVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  undefined1 local_90 [8];
  wstring tmp;
  string local_50;
  
  __s = GetOidString(this->oidIndex);
  if (__s != (char *)0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,__s + sVar2);
    utf8ToUtf16((wstring *)local_90,&local_50);
    std::__cxx11::wstring::operator=((wstring *)out,(wstring *)local_90);
    if (local_90 != (undefined1  [8])&tmp._M_string_length) {
      operator_delete((void *)local_90);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  local_90 = (undefined1  [8])&tmp._M_string_length;
  tmp._M_dataplus._M_p = (pointer)0x0;
  tmp._M_string_length._0_4_ = 0;
  pbVar1 = (this->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pbVar8 = (this->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pbVar8 == pbVar1) {
LAB_001390ce:
    bVar12 = false;
    goto LAB_001390d1;
  }
  if (*pbVar1 < 0x28) {
    std::__cxx11::wstring::_M_replace((ulong)local_90,0,(wchar_t *)0x0,0x13f050);
    __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               ((long)&tmp.field_2 + 8),vswprintf,0x10,L"%d",
               (ulong)*(this->value).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start);
    pwVar3 = (wstring *)
             std::__cxx11::wstring::replace
                       ((ulong)((long)&tmp.field_2 + 8),0,(wchar_t *)0x0,0x13f058);
    std::__cxx11::wstring::wstring((wstring *)&local_50,pwVar3);
    std::__cxx11::wstring::_M_append((wchar_t *)local_90,(ulong)local_50._M_dataplus._M_p);
LAB_00138e69:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((undefined1 *)tmp.field_2._8_8_ != &stack0xffffffffffffffa0) {
      operator_delete((void *)tmp.field_2._8_8_);
    }
    uVar11 = 1;
  }
  else {
    if (*pbVar1 < 0x50) {
      std::__cxx11::wstring::_M_replace((ulong)local_90,0,(wchar_t *)0x0,0x13f060);
      __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
                ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 ((long)&tmp.field_2 + 8),vswprintf,0x10,L"%d",
                 (ulong)(*(this->value).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start - 0x28));
      pwVar3 = (wstring *)
               std::__cxx11::wstring::replace
                         ((ulong)((long)&tmp.field_2 + 8),0,(wchar_t *)0x0,0x13f058);
      std::__cxx11::wstring::wstring((wstring *)&local_50,pwVar3);
      std::__cxx11::wstring::_M_append((wchar_t *)local_90,(ulong)local_50._M_dataplus._M_p);
      goto LAB_00138e69;
    }
    pbVar8 = pbVar8 + ~(ulong)pbVar1;
    pbVar6 = (byte *)0x5;
    if (pbVar8 < (byte *)0x5) {
      pbVar6 = pbVar8;
    }
    iVar9 = (int)pbVar6 + 1;
    pbVar8 = (byte *)0x0;
    uVar11 = 0;
    do {
      uVar11 = pbVar1[(long)pbVar8] & 0x7f | uVar11;
      if (-1 < (char)pbVar1[(long)pbVar8]) {
        iVar9 = (int)pbVar8;
        break;
      }
      uVar11 = uVar11 << 7;
      pbVar8 = pbVar8 + 1;
    } while (pbVar6 + 1 != pbVar8);
    bVar12 = false;
    if ((iVar9 == 6) || (uVar11 >> 0x20 != 0)) goto LAB_001390d1;
    if (uVar11 < 0x50) goto LAB_001390ce;
    std::__cxx11::wstring::_M_replace((ulong)local_90,0,(wchar_t *)0x0,0x13f068);
    __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               ((long)&tmp.field_2 + 8),vswprintf,0x20,L"%lu",uVar11 - 0x50);
    pwVar3 = (wstring *)
             std::__cxx11::wstring::replace
                       ((ulong)((long)&tmp.field_2 + 8),0,(wchar_t *)0x0,0x13f058);
    std::__cxx11::wstring::wstring((wstring *)&local_50,pwVar3);
    std::__cxx11::wstring::_M_append((wchar_t *)local_90,(ulong)local_50._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    uVar11 = (ulong)(iVar9 + 1);
    if ((undefined1 *)tmp.field_2._8_8_ != &stack0xffffffffffffffa0) {
      operator_delete((void *)tmp.field_2._8_8_);
    }
  }
  puVar4 = (this->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(this->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar4;
  if (uVar11 < uVar5) {
    bVar12 = false;
    do {
      uVar5 = uVar5 - 1;
      if (4 < uVar5) {
        uVar5 = 5;
      }
      iVar9 = (int)uVar5 + 1;
      lVar7 = 0;
      uVar10 = 0;
      do {
        uVar10 = puVar4[lVar7 + uVar11] & 0x7f | uVar10;
        if (-1 < (char)puVar4[lVar7 + uVar11]) {
          iVar9 = (int)lVar7;
          break;
        }
        uVar10 = uVar10 << 7;
        lVar7 = lVar7 + 1;
      } while (uVar5 + 1 != lVar7);
      if ((iVar9 == 6) || (uVar10 >> 0x20 != 0)) goto LAB_001390d1;
      __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
                ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 (&tmp.field_2._M_allocated_capacity + 1),vswprintf,0x20,L"%lu");
      pwVar3 = (wstring *)
               std::__cxx11::wstring::replace
                         ((ulong)(&tmp.field_2._M_allocated_capacity + 1),0,(wchar_t *)0x0,0x13f058)
      ;
      std::__cxx11::wstring::wstring((wstring *)&local_50,pwVar3);
      std::__cxx11::wstring::_M_append((wchar_t *)local_90,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((undefined1 *)tmp.field_2._8_8_ != &stack0xffffffffffffffa0) {
        operator_delete((void *)tmp.field_2._8_8_);
      }
      uVar11 = uVar11 + (iVar9 + 1);
      puVar4 = (this->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar5 = (long)(this->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar4;
    } while (uVar11 < uVar5);
  }
  std::__cxx11::wstring::swap((wstring *)out);
  bVar12 = true;
LAB_001390d1:
  if (local_90 != (undefined1  [8])&tmp._M_string_length) {
    operator_delete((void *)local_90);
  }
  return bVar12;
}

Assistant:

bool ObjectIdentifier::ToString(std::wstring & out) const
{
	// If possible, just look it up in our table
	const char* szOid = this->GetOidString();

	if (szOid != nullptr)
		out = utf8ToUtf16(szOid);

	std::wstring tmp;
	size_t cbRead = 0;
	size_t pos = 0;
	unsigned long node = 0;

	if (value.size() < 1)
		return false;

	if (value[0] < 40)
	{
		tmp = L"0";
		tmp += L"." + std::to_wstring(value[0]);
		cbRead = 1;
	}
	else if (value[0] < 80)
	{
		tmp = L"1";
		tmp += L"." + std::to_wstring(value[0] - 40);
		cbRead = 1;
	}
	else
	{
		if (!DecodeLong(&value[0], value.size(), node, cbRead) || node < 80)
			return false;

		tmp = L"2";
		tmp += L"." + std::to_wstring(node - 80);
	}

	pos = cbRead;

	for (; pos < value.size(); pos += cbRead)
	{
		if (!DecodeLong(&value[pos], value.size(), node, cbRead))
			return false;

		tmp += L"." + std::to_wstring(node);
	}

	out.swap(tmp);
	return true;
}